

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var.c
# Opt level: O2

tool_var * varcontent(GlobalConfig *global,char *name,size_t nlen)

{
  int iVar1;
  size_t sVar2;
  tool_var *ptVar3;
  
  ptVar3 = (tool_var *)&global->variables;
  do {
    ptVar3 = ptVar3->next;
    if (ptVar3 == (tool_var *)0x0) {
      return (tool_var *)0x0;
    }
    sVar2 = strlen(ptVar3->name);
  } while ((sVar2 != nlen) || (iVar1 = strncmp(name,ptVar3->name,nlen), iVar1 != 0));
  return ptVar3;
}

Assistant:

static const struct tool_var *varcontent(struct GlobalConfig *global,
                                         const char *name, size_t nlen)
{
  struct tool_var *list = global->variables;
  while(list) {
    if((strlen(list->name) == nlen) &&
       !strncmp(name, list->name, nlen)) {
      return list;
    }
    list = list->next;
  }
  return NULL;
}